

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextDiagnosticClient.cpp
# Opt level: O3

void __thiscall slang::SourceSnippet::~SourceSnippet(SourceSnippet *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer p;
  pointer p_00;
  
  pcVar2 = (this->highlightLine)._M_dataplus._M_p;
  paVar1 = &(this->highlightLine).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->snippetLine)._M_dataplus._M_p;
  paVar1 = &(this->snippetLine).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  p = (this->invalidRanges).super_SmallVectorBase<std::pair<unsigned_long,_unsigned_long>_>.data_;
  if (p != (pointer)(this->invalidRanges).
                    super_SmallVectorBase<std::pair<unsigned_long,_unsigned_long>_>.firstElement) {
    operator_delete(p);
  }
  p_00 = (this->byteToColumn).super_SmallVectorBase<int>.data_;
  if (p_00 != (pointer)(this->byteToColumn).super_SmallVectorBase<int>.firstElement) {
    operator_delete(p_00);
    return;
  }
  return;
}

Assistant:

SourceSnippet(std::string_view sourceLine, uint32_t tabStop) {
        SLANG_ASSERT(!sourceLine.empty());

        byteToColumn.resize(sourceLine.size() + 1);
        for (size_t i = 0; i < byteToColumn.size(); i++)
            byteToColumn[i] = -1;

        snippetLine.reserve(sourceLine.size());

        SmallVector<char> buffer;
        size_t column = 0;
        size_t i = 0;
        while (i < sourceLine.size()) {
            byteToColumn[i] = (int)column;

            size_t columnWidth;
            buffer.clear();
            if (!printableTextForNextChar(sourceLine, i, tabStop, buffer, columnWidth))
                invalidRanges.push_back({snippetLine.size(), buffer.size()});

            snippetLine.append(buffer.data(), buffer.size());
            column += columnWidth;
        }

        byteToColumn[sourceLine.size()] = (int)column;
        highlightLine = std::string(column, ' ');
    }